

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

longdouble * __thiscall
BMP::byteSizeCode(longdouble *__return_storage_ptr__,BMP *this,typeOfCode type)

{
  anon_class_8_1_8991f0d2 aVar1;
  undefined1 auStack_28 [8];
  longdouble temp;
  int local_14;
  longdouble *plStack_10;
  typeOfCode type_local;
  BMP *this_local;
  
  local_14 = (int)this;
  _auStack_28 = (longdouble)0;
  plStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    aVar1 = std::for_each<bitMap::GreyCount*,BMP::byteSizeCode(typeOfCode)::__1>
                      (*(GreyCount **)(*(long *)(__return_storage_ptr__ + 0x45) + 8),
                       (GreyCount *)
                       (*(long *)(*(long *)(__return_storage_ptr__ + 0x45) + 8) +
                       (long)**(int **)(__return_storage_ptr__ + 0x45) * 0x80),
                       (anon_class_8_1_8991f0d2)auStack_28);
  }
  else if (local_14 == 1) {
    aVar1 = std::for_each<bitMap::GreyCount*,BMP::byteSizeCode(typeOfCode)::__2>
                      (*(GreyCount **)(*(long *)(__return_storage_ptr__ + 0x45) + 8),
                       (GreyCount *)
                       (*(long *)(*(long *)(__return_storage_ptr__ + 0x45) + 8) +
                       (long)**(int **)(__return_storage_ptr__ + 0x45) * 0x80),
                       (anon_class_8_1_8991f0d2)auStack_28);
  }
  else {
    aVar1.temp = (longdouble *)(ulong)(local_14 - 2U);
    if (local_14 - 2U == 0) {
      aVar1 = std::for_each<bitMap::GreyCount*,BMP::byteSizeCode(typeOfCode)::__0>
                        (*(GreyCount **)(*(long *)(__return_storage_ptr__ + 0x45) + 8),
                         (GreyCount *)
                         (*(long *)(*(long *)(__return_storage_ptr__ + 0x45) + 8) +
                         (long)**(int **)(__return_storage_ptr__ + 0x45) * 0x80),
                         (anon_class_8_1_8991f0d2)auStack_28);
    }
  }
  return aVar1.temp;
}

Assistant:

long double BMP::byteSizeCode( typeOfCode type )
{
    using namespace std;
    using namespace bitMap;
    long double temp = 0;

    switch( type ){
        case SHANNON:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeShannonFano.size() );
            });
            break;
        case UNIFORM:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.uniformCodes.size() );
            });
            break;
        case HUFFMAN:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeHuffman.size() );
            });
            break;
    }
    return temp;
}